

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_basic_ostream
          (sync_basic_ostream<char,_std::char_traits<char>_> *this,comm *comm,int root,
          base_stream *stream)

{
  _func_int *p_Var1;
  int iVar2;
  stringbuf *this_00;
  base_stream *stream_local;
  int root_local;
  comm *comm_local;
  sync_basic_ostream<char,_std::char_traits<char>_> *this_local;
  
  std::ios::ios((ios *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28);
  std::ostream::ostream(this);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__sync_basic_ostream_00295ce8;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 =
       &PTR__sync_basic_ostream_00295d10;
  *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 = comm;
  *(base_stream **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10 = stream;
  *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 = root;
  this_00 = (stringbuf *)operator_new(0x68);
  std::__cxx11::stringbuf::stringbuf(this_00);
  std::unique_ptr<std::__cxx11::stringbuf,std::default_delete<std::__cxx11::stringbuf>>::
  unique_ptr<std::default_delete<std::__cxx11::stringbuf>,void>
            ((unique_ptr<std::__cxx11::stringbuf,std::default_delete<std::__cxx11::stringbuf>> *)
             &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20,(pointer)this_00
            );
  if (-1 < root) {
    iVar2 = mxx::comm::size(comm);
    if (root < iVar2) goto LAB_001fb27e;
  }
  assert_fail("0 <= root && root < comm.size()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
              ,0x31,"sync_basic_ostream");
LAB_001fb27e:
  p_Var1 = (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3];
  std::
  unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get((unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20);
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_basic_ostream<char,_std::char_traits<char>_>).
                          _vptr_basic_ostream + (long)p_Var1));
  return;
}

Assistant:

sync_basic_ostream(const mxx::comm& comm, int root, base_stream& stream) : m_comm(comm), m_stream(&stream), m_root(root), m_buf(new strbuf_t()) {
        MXX_ASSERT(0 <= root && root < comm.size());
        this->rdbuf(m_buf.get());
    }